

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void AddWindowToSortedBuffer(ImVector<ImGuiWindow_*> *out_sorted_windows,ImGuiWindow *window)

{
  int *piVar1;
  uint uVar2;
  ImGuiWindow *window_00;
  int iVar3;
  ImGuiWindow **__dest;
  ImGuiContext *pIVar4;
  int iVar5;
  int iVar6;
  ImGuiWindow **ppIVar7;
  ulong uVar8;
  
  pIVar4 = GImGui;
  iVar3 = out_sorted_windows->Size;
  if (iVar3 != out_sorted_windows->Capacity) {
    __dest = out_sorted_windows->Data;
    goto LAB_001337e2;
  }
  if (iVar3 == 0) {
    iVar5 = 8;
  }
  else {
    iVar5 = iVar3 / 2 + iVar3;
  }
  iVar6 = iVar3 + 1;
  if (iVar3 + 1 < iVar5) {
    iVar6 = iVar5;
  }
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  __dest = (ImGuiWindow **)(*(pIVar4->IO).MemAllocFn)((long)iVar6 << 3);
  if (out_sorted_windows->Data == (ImGuiWindow **)0x0) {
LAB_001337cf:
    ppIVar7 = (ImGuiWindow **)0x0;
    pIVar4 = GImGui;
  }
  else {
    memcpy(__dest,out_sorted_windows->Data,(long)out_sorted_windows->Size << 3);
    pIVar4 = GImGui;
    ppIVar7 = out_sorted_windows->Data;
    if (ppIVar7 == (ImGuiWindow **)0x0) goto LAB_001337cf;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar4->IO).MemFreeFn)(ppIVar7);
  out_sorted_windows->Data = __dest;
  out_sorted_windows->Capacity = iVar6;
  iVar3 = out_sorted_windows->Size;
LAB_001337e2:
  out_sorted_windows->Size = iVar3 + 1;
  __dest[iVar3] = window;
  if (window->Active == true) {
    uVar2 = (window->DC).ChildWindows.Size;
    if ((int)uVar2 < 2) {
      if (uVar2 != 1) {
        return;
      }
    }
    else {
      qsort((window->DC).ChildWindows.Data,(ulong)uVar2,8,ChildWindowComparer);
    }
    uVar8 = 0;
    do {
      if ((long)(window->DC).ChildWindows.Size <= (long)uVar8) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                      ,0x353,
                      "value_type &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      window_00 = (window->DC).ChildWindows.Data[uVar8];
      if (window_00->Active == true) {
        AddWindowToSortedBuffer(out_sorted_windows,window_00);
      }
      uVar8 = uVar8 + 1;
    } while (uVar2 != uVar8);
  }
  return;
}

Assistant:

static void AddWindowToSortedBuffer(ImVector<ImGuiWindow*>& out_sorted_windows, ImGuiWindow* window)
{
    out_sorted_windows.push_back(window);
    if (window->Active)
    {
        int count = window->DC.ChildWindows.Size;
        if (count > 1)
            qsort(window->DC.ChildWindows.begin(), (size_t)count, sizeof(ImGuiWindow*), ChildWindowComparer);
        for (int i = 0; i < count; i++)
        {
            ImGuiWindow* child = window->DC.ChildWindows[i];
            if (child->Active)
                AddWindowToSortedBuffer(out_sorted_windows, child);
        }
    }
}